

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

void __thiscall
optimization::common_expr_del::Common_Expr_Del::Common_Expr_Del
          (Common_Expr_Del *this,bool offset_inst)

{
  byte bVar1;
  byte in_SIL;
  MirOptimizePass *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff0;
  MirOptimizePass *__s;
  
  bVar1 = in_SIL & 1;
  __s = in_RDI;
  backend::MirOptimizePass::MirOptimizePass(in_RDI);
  in_RDI->_vptr_MirOptimizePass = (_func_int **)&PTR_pass_name_abi_cxx11__0036e3f8;
  *(byte *)&in_RDI[1]._vptr_MirOptimizePass = bVar1 & 1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x165647);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (unaff_retaddr,(char *)__s,(allocator<char> *)CONCAT17(bVar1,in_stack_fffffffffffffff0))
  ;
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff6);
  return;
}

Assistant:

Common_Expr_Del(bool offset_inst = false) : offset_inst(offset_inst) {}